

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

nng_err nni_http_handler_init_redirect
                  (nni_http_handler **hpp,char *uri,nng_http_status status,char *where)

{
  nng_err nVar1;
  nng_http_status *data;
  char *pcVar2;
  http_redirect *hr;
  nni_http_handler *pnStack_38;
  nng_err rv;
  nni_http_handler *h;
  char *where_local;
  char *pcStack_20;
  nng_http_status status_local;
  char *uri_local;
  nni_http_handler **hpp_local;
  
  h = (nni_http_handler *)where;
  where_local._4_4_ = status;
  pcStack_20 = uri;
  uri_local = (char *)hpp;
  data = (nng_http_status *)nni_zalloc(0x18);
  if (data != (nng_http_status *)0x0) {
    pcVar2 = nni_strdup((char *)h);
    *(char **)(data + 2) = pcVar2;
    if (pcVar2 != (char *)0x0) {
      pcVar2 = nni_strdup(pcStack_20);
      *(char **)(data + 4) = pcVar2;
      if (pcVar2 != (char *)0x0) {
        if (where_local._4_4_ == 0) {
          where_local._4_4_ = NNG_HTTP_STATUS_STATUS_MOVED_PERMANENTLY;
        }
        *data = where_local._4_4_;
        nVar1 = nni_http_handler_init(&stack0xffffffffffffffc8,pcStack_20,http_handle_redirect);
        if (nVar1 == NNG_OK) {
          nni_http_handler_set_method(pnStack_38,(char *)0x0);
          nni_http_handler_set_data(pnStack_38,data,http_redirect_free);
          nni_http_handler_collect_body(pnStack_38,false,0);
          *(nni_http_handler **)uri_local = pnStack_38;
          return NNG_OK;
        }
        http_redirect_free(data);
        return nVar1;
      }
    }
    http_redirect_free(data);
  }
  return NNG_ENOMEM;
}

Assistant:

nng_err
nni_http_handler_init_redirect(nni_http_handler **hpp, const char *uri,
    nng_http_status status, const char *where)
{
	nni_http_handler *h;
	nng_err           rv;
	http_redirect    *hr;

	if ((hr = NNI_ALLOC_STRUCT(hr)) == NULL) {
		return (NNG_ENOMEM);
	}
	if (((hr->where = nni_strdup(where)) == NULL) ||
	    ((hr->from = nni_strdup(uri)) == NULL)) {
		http_redirect_free(hr);
		return (NNG_ENOMEM);
	}
	if (status == 0) {
		status = NNG_HTTP_STATUS_STATUS_MOVED_PERMANENTLY;
	}
	hr->code = status;

	if ((rv = nni_http_handler_init(&h, uri, http_handle_redirect)) != 0) {
		http_redirect_free(hr);
		return (rv);
	}

	nni_http_handler_set_method(h, NULL);

	nni_http_handler_set_data(h, hr, http_redirect_free);

	// We don't need to collect the body at all, because the handler
	// just discards the content and closes the connection.
	nni_http_handler_collect_body(h, false, 0);

	*hpp = h;
	return (NNG_OK);
}